

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLock::ArchiveOUT(ChLinkLock *this,ChArchiveOut *marchive)

{
  LinkType_mapper typemapper;
  ChEnumMapper<chrono::ChLinkLock::LinkType> local_78;
  LinkType_mapper local_58;
  _Head_base<0UL,_chrono::ChLinkForce_*,_false> local_38;
  undefined1 *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkLock>(marchive);
  ChLinkMarkers::ArchiveOUT(&this->super_ChLinkMarkers,marchive);
  my_enum_mappers_types::LinkType_mapper::LinkType_mapper(&local_58);
  my_enum_mappers_types::LinkType_mapper::operator()(&local_78,&local_58,&this->type);
  local_38._M_head_impl = (ChLinkForce *)0x9643db;
  local_28 = 0;
  local_30 = (undefined1 *)&local_78;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive,&local_38);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b16bb0
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.value_ptr = (LinkType *)&this->d_restlength;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9643e5;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_38._M_head_impl =
       (this->force_D)._M_t.
       super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
       super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
       super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9643f2;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_78.value_ptr = (LinkType *)&local_38;
  ChArchiveOut::out<chrono::ChLinkForce>(marchive,(ChNameValue<chrono::ChLinkForce_*> *)&local_78);
  local_58.super_ChEnumMapper<chrono::ChLinkLock::LinkType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b16bb0;
  if (local_58.super_ChEnumMapper<chrono::ChLinkLock::LinkType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super_ChEnumMapper<chrono::ChLinkLock::LinkType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChLinkLock::LinkType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChLinkLock::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkLock>();

    // serialize parent class
    ChLinkMarkers::ArchiveOUT(marchive);

    // serialize all member data
    my_enum_mappers_types::LinkType_mapper typemapper;
    marchive << CHNVP(typemapper(type), "link_type");

    ////marchive << CHNVP(mask); //// TODO: needed?

    marchive << CHNVP(d_restlength);

    marchive << CHNVP(force_D.get());

    ////marchive << CHNVP(force_D);
    ////marchive << CHNVP(force_R);
    ////marchive << CHNVP(force_X);
    ////marchive << CHNVP(force_Y);
    ////marchive << CHNVP(force_Z);
    ////marchive << CHNVP(force_Rx);
    ////marchive << CHNVP(force_Ry);
    ////marchive << CHNVP(force_Rz);

    ////marchive << CHNVP(limit_X);
    ////marchive << CHNVP(limit_Y);
    ////marchive << CHNVP(limit_Z);
    ////marchive << CHNVP(limit_Rx);
    ////marchive << CHNVP(limit_Ry);
    ////marchive << CHNVP(limit_Rz);
    ////marchive << CHNVP(limit_Rp);
    ////marchive << CHNVP(limit_D);
}